

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  
  bVar13 = false;
  uVar6 = std::__cxx11::string::find((char *)unit_string,(ulong)(modifier->_M_dataplus)._M_p,0);
  if (uVar6 != 0xffffffffffffffff) {
    cVar11 = (char)unit_string;
    lVar7 = std::__cxx11::string::find_first_not_of(cVar11,0x20);
    if ((lVar7 == -1) ||
       (pcVar3 = (unit_string->_M_dataplus)._M_p, cVar1 = pcVar3[lVar7],
       cVar1 != check1 && cVar1 != check2)) {
      bVar13 = false;
    }
    else {
      pcVar3[lVar7 + -1] = '_';
      bVar13 = true;
    }
    uVar8 = std::__cxx11::string::find(cVar11,0x20);
    if (uVar8 < unit_string->_M_string_length) {
      pcVar3 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar3[uVar8 + 1];
      if ((cVar1 != '*') && (cVar1 != '/')) {
        cVar2 = pcVar3[uVar8 - 1];
        bVar12 = cVar2 == '*' || cVar2 == '/';
        if ((cVar2 != '*') && (cVar2 != '/')) {
          bVar14 = true;
          bVar12 = true;
          bVar4 = 1;
          if (cVar2 != '(' && cVar1 != '(') {
            bVar4 = 0;
            if (cVar1 != '-') {
              bVar12 = cVar2 == '-';
              bVar4 = 0;
            }
          }
          if (!(bool)(bVar4 | bVar12)) {
            iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar8 + 1,(char *)0x2);
            bVar14 = iVar5 == 0;
          }
          bVar14 = (bool)(bVar14 | bVar4 | bVar12);
          bVar12 = true;
          if (!bVar14) {
            bVar12 = (unit_string->_M_dataplus)._M_p[uVar8 + 1] == 'U';
          }
          bVar12 = (bool)(bVar12 | bVar14);
        }
        if (!bVar12) {
          uVar9 = std::__cxx11::string::rfind(cVar11,0x2f);
          uVar10 = std::__cxx11::string::find(cVar11,0x2f);
          if (uVar9 < uVar6) {
            std::__cxx11::string::insert((ulong)unit_string,uVar9 + 1,'\x01');
            if (uVar10 == 0xffffffffffffffff) {
              std::__cxx11::string::push_back(cVar11);
            }
            else {
              std::__cxx11::string::insert((ulong)unit_string,uVar10 + 1,'\x01');
            }
            bVar12 = uVar10 <= uVar8;
            bVar13 = true;
            uVar8 = uVar8 + 1;
          }
          else {
            bVar12 = uVar10 < uVar8;
          }
        }
        if (!bVar12) {
          (unit_string->_M_dataplus)._M_p[uVar8] = '*';
          bVar13 = true;
        }
      }
    }
  }
  return bVar13;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}